

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O2

void __thiscall cow_guarded_cow_guarded_1_Test::TestBody(cow_guarded_cow_guarded_1_Test *this)

{
  pointer *__ptr;
  _func_int **pp_Var1;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  thread th3;
  thread th2;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  thread th1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  AssertHelper local_e0;
  shared_handle data_handle_1;
  handle data_handle;
  cow_guarded<int,_std::timed_mutex> data;
  
  data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
  _M_head_impl.m_lock._M_device =
       (mutex_type *)
       ((ulong)data_handle.
               super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
               _M_t.
               super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
               ._M_t.
               super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
               .
               super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
               .
               super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
               ._M_head_impl.m_lock._M_device & 0xffffffff00000000);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>(&data,(int *)&data_handle);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock(&data_handle,&data);
  *data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
   _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
   _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
   .super__Head_base<0UL,_int_*,_false>._M_head_impl =
       *data_handle.
        super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
        super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        _M_t.
        super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
        .super__Head_base<0UL,_int_*,_false>._M_head_impl + 1;
  std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
            (&data_handle.
              super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&data_handle_1);
  local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar3 = CONCAT71(data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _1_7_,(char)data_handle_1.
                               super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr) !=
          0;
  th1._M_id._M_thread._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&th2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&th1,(AssertionResult *)"data_handle != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x29,(char *)data_handle.
                             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             ._M_t.
                             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             .
                             super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             .
                             super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                             ._M_head_impl.m_lock._M_device);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th3,(Message *)&th2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th3);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th2._M_id._M_thread != 0) {
      (**(code **)(*(long *)th2._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
  th1._M_id._M_thread._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",
             (int *)CONCAT71(data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             (char)data_handle_1.
                                   super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ,(int *)&th1);
  if ((char)data_handle.
            super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
            _M_t.
            super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
            ._M_t.
            super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
            .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
            super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
            ._M_head_impl.m_lock._M_device == '\0') {
    testing::Message::Message((Message *)&th1);
    if (data_handle.
        super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
        super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        _M_t.
        super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
        .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
        _M_head_impl.m_lock._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)data_handle.
                         super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         ._M_t.
                         super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         .
                         super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         .
                         super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                         ._M_head_impl.m_lock._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&data_handle.
                           super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           ._M_t.
                           super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           .
                           super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   + 8));
  th1._M_id._M_thread = (id)0;
  data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
  _M_head_impl.m_lock._M_device = (mutex_type *)operator_new(0x10);
  ((data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
    ._M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    _M_t.
    super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
    _M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_0016a960;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&((data_handle.
             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             _M_t.
             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             ._M_t.
             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
             ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex + 8) = &data;
  std::thread::_M_start_thread(&th1,&data_handle,0);
  if (data_handle.
      super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
      super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t
      .super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
      _M_head_impl.m_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((data_handle.
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                   ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  th2._M_id._M_thread = (id)0;
  data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
  _M_head_impl.m_lock._M_device = (mutex_type *)operator_new(0x10);
  ((data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
    ._M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    _M_t.
    super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
    _M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_0016a9a0;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&((data_handle.
             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             _M_t.
             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             ._M_t.
             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
             ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex + 8) = &data;
  std::thread::_M_start_thread(&th2,&data_handle,0);
  if (data_handle.
      super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
      super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t
      .super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
      _M_head_impl.m_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((data_handle.
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                   ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  th3._M_id._M_thread = (id)0;
  data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
  _M_head_impl.m_lock._M_device = (mutex_type *)operator_new(0x10);
  ((data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
    ._M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    _M_t.
    super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
    _M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_0016a9e0;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&((data_handle.
             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             _M_t.
             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             ._M_t.
             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
             ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex + 8) = &data;
  std::thread::_M_start_thread(&th3,&data_handle,0);
  if (data_handle.
      super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
      super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t
      .super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
      _M_head_impl.m_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((data_handle.
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                   ._M_head_impl.m_lock._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&th3);
  std::thread::~thread(&th2);
  std::thread::~thread(&th1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock(&data_handle,&data);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&th1);
  *data_handle.super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
   _M_t.super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
   _M_t.super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
   .super__Head_base<0UL,_int_*,_false>._M_head_impl =
       *data_handle.
        super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
        super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        _M_t.
        super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
        .super__Head_base<0UL,_int_*,_false>._M_head_impl + 1;
  th2._M_id._M_thread._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle_1,"*data_handle","2",
             data_handle.
             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
             _M_t.
             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             ._M_t.
             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
             .super__Head_base<0UL,_int_*,_false>._M_head_impl,(int *)&th2);
  if ((char)data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
  {
    testing::Message::Message((Message *)&th2);
    if (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var1 = (_func_int **)0x14a73a;
    }
    else {
      pp_Var1 = (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x4d,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th3,(Message *)&th2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th3);
    if (th2._M_id._M_thread != 0) {
      (**(code **)(*(long *)th2._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  local_f8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  th2._M_id._M_thread._0_1_ = th1._M_id._M_thread != 0;
  if (th1._M_id._M_thread == 0) {
    testing::Message::Message((Message *)&th3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle_1,(internal *)&th2,
               (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x4f,(char *)CONCAT71(data_handle_1.
                                      super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr._1_7_,
                                      (char)data_handle_1.
                                            super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&th3);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle_1);
    if (th3._M_id._M_thread != 0) {
      (**(code **)(*(long *)th3._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
  th2._M_id._M_thread._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle_1,"*data_handle2","1",(int *)th1._M_id._M_thread,(int *)&th2);
  if ((char)data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
  {
    testing::Message::Message((Message *)&th2);
    if (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var1 = (_func_int **)0x14a73a;
    }
    else {
      pp_Var1 = (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x50,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th3,(Message *)&th2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th3);
    if (th2._M_id._M_thread != 0) {
      (**(code **)(*(long *)th2._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::handle::cancel(&data_handle);
  local_f8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  th2._M_id._M_thread._0_1_ =
       data_handle.
       super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
       super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
       _M_t.
       super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl == (int *)0x0;
  if (data_handle.
      super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
      super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t
      .super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
    testing::Message::Message((Message *)&th3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle_1,(internal *)&th2,(AssertionResult *)"data_handle == nullptr"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x53,(char *)CONCAT71(data_handle_1.
                                      super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr._1_7_,
                                      (char)data_handle_1.
                                            super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&th3);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle_1);
    if (th3._M_id._M_thread != 0) {
      (**(code **)(*(long *)th3._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
  local_f8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  th2._M_id._M_thread._0_1_ = th1._M_id._M_thread != 0;
  if (th1._M_id._M_thread == 0) {
    testing::Message::Message((Message *)&th3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle_1,(internal *)&th2,
               (AssertionResult *)"data_handle2 != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x55,(char *)CONCAT71(data_handle_1.
                                      super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr._1_7_,
                                      (char)data_handle_1.
                                            super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&th3);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle_1);
    if (th3._M_id._M_thread != 0) {
      (**(code **)(*(long *)th3._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
  th2._M_id._M_thread._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle_1,"*data_handle2","1",(int *)th1._M_id._M_thread,(int *)&th2);
  if ((char)data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
  {
    testing::Message::Message((Message *)&th2);
    if (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var1 = (_func_int **)0x14a73a;
    }
    else {
      pp_Var1 = (data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x56,(char *)pp_Var1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th3,(Message *)&th2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th3);
    if (th2._M_id._M_thread != 0) {
      (**(code **)(*(long *)th2._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
  std::unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>::~unique_ptr
            (&data_handle.
              super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>);
  gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock_shared
            ((cow_guarded<int,_std::timed_mutex> *)&data_handle_1);
  local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar3 = CONCAT71(data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _1_7_,(char)data_handle_1.
                               super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr) !=
          0;
  th1._M_id._M_thread._0_1_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&th2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&th1,(AssertionResult *)"data_handle != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x5c,(char *)data_handle.
                             super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             ._M_t.
                             super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             .
                             super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                             .
                             super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                             ._M_head_impl.m_lock._M_device);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th3,(Message *)&th2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th3);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th2._M_id._M_thread != 0) {
      (**(code **)(*(long *)th2._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
  th1._M_id._M_thread._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",
             (int *)CONCAT71(data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             (char)data_handle_1.
                                   super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ,(int *)&th1);
  if ((char)data_handle.
            super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
            _M_t.
            super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
            ._M_t.
            super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
            .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
            super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
            ._M_head_impl.m_lock._M_device == '\0') {
    testing::Message::Message((Message *)&th1);
    if (data_handle.
        super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
        super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        _M_t.
        super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
        .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
        super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>.
        _M_head_impl.m_lock._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)data_handle.
                         super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         ._M_t.
                         super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         .
                         super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                         .
                         super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
                         ._M_head_impl.m_lock._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/cow_guardedTests.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&data_handle.
                           super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           ._M_t.
                           super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                           .
                           super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data_handle_1.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  gmlc::libguarded::lr_guarded<std::shared_ptr<const_int>,_std::mutex>::~lr_guarded(&data.m_data);
  return;
}

Assistant:

TEST(cow_guarded, cow_guarded_1)
{
    cow_guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data]() {
            auto data_handle2 = data.try_lock_shared();
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th2([&data]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th3([&data]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        th1.join();

        th2.join();
        th3.join();
    }

    {
        auto data_handle = data.lock();

        auto data_handle2 = data.lock_shared();

        ++(*data_handle);
        EXPECT_EQ(*data_handle, 2);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);

        data_handle.cancel();
        EXPECT_TRUE(data_handle == nullptr);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);
    }
}